

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O1

void testing::internal::PrintTo(char8_t *s,ostream *os)

{
  long lVar1;
  ostream *poVar2;
  size_t len;
  
  if (s != (char8_t *)0x0) {
    poVar2 = std::ostream::_M_insert<void_const*>(os);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," pointing to ",0xd);
    len = 0xffffffffffffffff;
    do {
      lVar1 = len + 1;
      len = len + 1;
    } while (s[lVar1] != '\0');
    PrintCharsAsStringTo<char8_t>(s,len,os);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"NULL",4);
  return;
}

Assistant:

void PrintTo(const char8_t* s, ostream* os) { PrintCStringTo(s, os); }